

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paper_example_put_array.c
# Opt level: O0

void paper_example_put_array(void)

{
  bsp_pid_t maxprocs;
  uint local_1c;
  uint local_18;
  int xs [3];
  bsp_pid_t s;
  bsp_pid_t p;
  
  maxprocs = bsp_nprocs();
  bsp_begin(maxprocs);
  xs[2] = bsp_nprocs();
  xs[1] = bsp_pid();
  local_1c = (xs[2] - xs[1]) * 3 - 1;
  local_18 = (xs[2] - xs[1]) * 3 - 2;
  xs[0] = (xs[2] - xs[1]) * 3 + -3;
  put_array((int *)&local_1c,xs[2] * 3);
  if (local_1c != xs[1] * 3) {
    printf("TEST FAILED: Expected %s to be equal to %s = %d but got %d\n   /workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/test/paper_example_put_array.c:%d\n"
           ,"xs[0]","s*3",(ulong)(uint)(xs[1] * 3),(ulong)local_1c,0x26);
    abort();
  }
  if (local_18 != xs[1] * 3 + 1U) {
    printf("TEST FAILED: Expected %s to be equal to %s = %d but got %d\n   /workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/test/paper_example_put_array.c:%d\n"
           ,"xs[1]","s*3 + 1",(ulong)(xs[1] * 3 + 1),(ulong)local_18,0x27);
    abort();
  }
  if (xs[0] != xs[1] * 3 + 2) {
    printf("TEST FAILED: Expected %s to be equal to %s = %d but got %d\n   /workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/test/paper_example_put_array.c:%d\n"
           ,"xs[2]","s*3 + 2",(ulong)(xs[1] * 3 + 2),(ulong)(uint)xs[0],0x28);
    abort();
  }
  bsp_end();
  return;
}

Assistant:

void put_array( int * xs, int n ) {
    int i, dst_pid, dst_idx;
    int p = bsp_nprocs();
    int n_over_p = n/p;

    if ((n%p) != 0)
        bsp_abort("{put_array} n=%d not divisible by p=%d\n", n, p);
    bsp_push_reg( xs, n_over_p*sizeof(xs[0]));
    bsp_sync();

    for (i = 0; i < n_over_p; ++i) {
        dst_pid = xs[i] / n_over_p;
        dst_idx = xs[i] % n_over_p;
        bsp_put( dst_pid, &xs[i], xs, dst_idx*sizeof(xs[0]), sizeof(xs[0]));
    }
    bsp_sync();
    bsp_pop_reg(xs);
}